

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlign_CeilPtr_Test::TestBody
          (ArenaAlign_CeilPtr_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ArenaAlign AVar2;
  char *pcVar3;
  uintptr_t intptr;
  ulong uVar4;
  AssertionResult gtest_ar;
  char p [129];
  AssertHelper local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  char local_110 [8];
  undefined8 local_108;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [62];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> abStack_c2 [64];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> abStack_82 [90];
  
  memset(local_100,0,0x81);
  AVar2 = ArenaAlignAs(0x40);
  uVar4 = -AVar2.align;
  local_120.data_ = (AssertHelperData *)((ulong)(local_100 + (AVar2.align - 1)) & uVar4);
  local_118._M_head_impl = local_100;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 0)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_108 ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
  pbVar1 = abStack_c2 + 2;
  local_120.data_ = (AssertHelperData *)((ulong)(local_100 + AVar2.align) & uVar4);
  local_118._M_head_impl = pbVar1;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 1)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_108 ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
  local_120.data_ = (AssertHelperData *)((ulong)(abStack_c2 + AVar2.align) & uVar4);
  local_118._M_head_impl = pbVar1;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 63)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_108 ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
  local_120.data_ = (AssertHelperData *)((ulong)(abStack_c2 + AVar2.align + 1) & uVar4);
  local_118._M_head_impl = pbVar1;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 64)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_108 ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
  pbVar1 = abStack_82 + 2;
  local_120.data_ = (AssertHelperData *)((ulong)(abStack_c2 + AVar2.align + 2) & uVar4);
  local_118._M_head_impl = pbVar1;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 65)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_108 ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
  local_120.data_ = (AssertHelperData *)((ulong)(abStack_82 + AVar2.align) & uVar4);
  local_118._M_head_impl = pbVar1;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 127)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_108 ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
  local_120.data_ = (AssertHelperData *)((ulong)(abStack_82 + AVar2.align + 1) & uVar4);
  local_118._M_head_impl = pbVar1;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 128)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
  return;
}

Assistant:

TEST(ArenaAlign, CeilPtr) {
  alignas(64) char p[129] = {0};
  auto align_64 = ArenaAlignAs(64);
  EXPECT_THAT(align_64.Ceil(p + 0), Eq(p));
  EXPECT_THAT(align_64.Ceil(p + 1), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 63), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 64), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 65), Eq(p + 128));
  EXPECT_THAT(align_64.Ceil(p + 127), Eq(p + 128));
  EXPECT_THAT(align_64.Ceil(p + 128), Eq(p + 128));
}